

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::GetTargetFlags
          (cmLocalGenerator *this,cmLinkLineComputer *linkLineComputer,string *config,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibs,string *flags,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkFlags,string *frameworkPath,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkPath,cmGeneratorTarget *target)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  string *psVar4;
  cmValue cVar5;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string extraLinkFlags;
  string cmp0065Flags;
  string linkLanguage;
  string configUpper;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [55];
  allocator<char> local_101;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  cmComputeLinkInformation *local_c0;
  cmLinkLineComputer *local_b8;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_b0;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_a8;
  undefined1 local_a0 [48];
  string local_70;
  string local_50;
  
  this_00 = &local_158;
  local_a8 = linkLibs;
  cmsys::SystemTools::UpperCase(&local_70,config);
  local_c0 = cmGeneratorTarget::GetLinkInformation(target,config);
  local_b8 = linkLineComputer;
  (*linkLineComputer->_vptr_cmLinkLineComputer[4])(&local_e0,linkLineComputer,target,config);
  TVar3 = cmGeneratorTarget::GetType(target);
  if (TVar3 < OBJECT_LIBRARY) {
    switch(TVar3) {
    case EXECUTABLE:
      local_158._M_string_length = 0;
      local_158.field_2._M_local_buf[0] = '\0';
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      bVar2 = std::operator!=(&local_e0,"Swift");
      if (bVar2) {
        pcVar1 = this->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_138,"CMAKE_EXE_LINKER_FLAGS",(allocator<char> *)local_a0);
        cmMakefile::GetSafeDefinition(pcVar1,(string *)local_138);
        std::__cxx11::string::_M_assign((string *)&local_158);
        std::__cxx11::string::~string((string *)local_138);
        std::__cxx11::string::append((char *)&local_158);
        if ((pointer)local_70._M_string_length != (pointer)0x0) {
          pcVar1 = this->Makefile;
          local_138._0_8_ = (pointer)0x17;
          local_138._8_8_ = "CMAKE_EXE_LINKER_FLAGS_";
          local_a0._0_8_ = local_70._M_string_length;
          local_a0._8_8_ = local_70._M_dataplus._M_p;
          cmStrCat<>(&local_100,(cmAlphaNum *)local_138,(cmAlphaNum *)local_a0);
          cmMakefile::GetSafeDefinition(pcVar1,&local_100);
          std::__cxx11::string::append((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::append((char *)&local_158);
        }
        if ((pointer)local_e0._M_string_length == (pointer)0x0) {
          psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138,"CMake can not determine linker language for target: ",psVar4);
          cmSystemTools::Error((string *)local_138);
          std::__cxx11::string::~string((string *)local_138);
          goto LAB_0022d5fa;
        }
        bVar2 = cmGeneratorTarget::IsWin32Executable(target,config);
        pcVar1 = this->Makefile;
        if (bVar2) {
          local_138._0_8_ = &DAT_00000006;
          local_138._8_8_ = "CMAKE_";
          local_a0._0_8_ = local_e0._M_string_length;
          local_a0._8_8_ = local_e0._M_dataplus._M_p;
          cmStrCat<char[18]>(&local_100,(cmAlphaNum *)local_138,(cmAlphaNum *)local_a0,
                             (char (*) [18])"_CREATE_WIN32_EXE");
          cmMakefile::GetSafeDefinition(pcVar1,&local_100);
          std::__cxx11::string::append((string *)&local_158);
        }
        else {
          local_138._0_8_ = &DAT_00000006;
          local_138._8_8_ = "CMAKE_";
          local_a0._0_8_ = local_e0._M_string_length;
          local_a0._8_8_ = local_e0._M_dataplus._M_p;
          cmStrCat<char[20]>(&local_100,(cmAlphaNum *)local_138,(cmAlphaNum *)local_a0,
                             (char (*) [20])"_CREATE_CONSOLE_EXE");
          cmMakefile::GetSafeDefinition(pcVar1,&local_100);
          std::__cxx11::string::append((string *)&local_158);
        }
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::append((char *)&local_158);
        bVar2 = cmGeneratorTarget::IsExecutableWithExports(target);
        if (bVar2) {
          pcVar1 = this->Makefile;
          local_138._0_8_ = (pointer)0x12;
          local_138._8_8_ = "CMAKE_EXE_EXPORTS_";
          local_a0._0_8_ = local_e0._M_string_length;
          local_a0._8_8_ = local_e0._M_dataplus._M_p;
          cmStrCat<char[6]>(&local_100,(cmAlphaNum *)local_138,(cmAlphaNum *)local_a0,
                            (char (*) [6])0x64061d);
          cmMakefile::GetSafeDefinition(pcVar1,&local_100);
          std::__cxx11::string::append((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::append((char *)&local_158);
        }
      }
      AddLanguageFlagsForLinking(this,flags,target,&local_e0,config);
      if (local_c0 != (cmComputeLinkInformation *)0x0) {
        OutputLinkLibraries(this,local_c0,local_b8,local_a8,frameworkPath,linkPath);
      }
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_138,"BUILD_SHARED_LIBS",(allocator<char> *)local_a0);
      bVar2 = cmMakefile::IsOn(pcVar1,(string *)local_138);
      std::__cxx11::string::~string((string *)local_138);
      if (bVar2) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                       ,"CMAKE_SHARED_BUILD_",&local_e0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                       ,"_FLAGS");
        std::__cxx11::string::~string((string *)local_a0);
        cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_138);
        std::__cxx11::string::append((string *)&local_158);
        std::__cxx11::string::append((char *)&local_158);
        std::__cxx11::string::~string((string *)local_138);
      }
      GetLinkLibsCMP0065(&local_100,this,&local_e0,target);
      if (local_100._M_string_length != 0) {
        std::__cxx11::string::append((string *)&local_158);
        std::__cxx11::string::append((char *)&local_158);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_138,"LINK_FLAGS",(allocator<char> *)local_a0);
      cVar5 = cmGeneratorTarget::GetProperty(target,(string *)local_138);
      std::__cxx11::string::~string((string *)local_138);
      if (cVar5.Value != (string *)0x0) {
        std::__cxx11::string::append((string *)&local_158);
        std::__cxx11::string::append((char *)&local_158);
      }
      if ((pointer)local_70._M_string_length != (pointer)0x0) {
        local_138._0_8_ = &DAT_0000000b;
        local_138._8_8_ = "LINK_FLAGS_";
        local_a0._0_8_ = local_70._M_string_length;
        local_a0._8_8_ = local_70._M_dataplus._M_p;
        cmStrCat<>(&local_50,(cmAlphaNum *)local_138,(cmAlphaNum *)local_a0);
        cVar5 = cmGeneratorTarget::GetProperty(target,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        if (cVar5.Value != (string *)0x0) {
          std::__cxx11::string::append((string *)&local_158);
          std::__cxx11::string::append((char *)&local_158);
        }
      }
      if (local_158._M_string_length != 0) {
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   linkFlags,&local_158);
      }
      cmGeneratorTarget::GetLinkOptions
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_138,target,config,&local_e0);
      AppendCompileOptions
                (this,linkFlags,
                 (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_138,(char *)0x0);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_138);
      std::__cxx11::string::~string((string *)&local_100);
      goto LAB_0022d57c;
    case STATIC_LIBRARY:
      GetStaticLibraryFlags
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_138,this,config,&local_e0,target);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_move_assign(linkFlags,
                       (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_138);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_138);
      goto LAB_0022d584;
    case SHARED_LIBRARY:
      __s = "CMAKE_SHARED_LINKER_FLAGS";
      break;
    case MODULE_LIBRARY:
      __s = "CMAKE_MODULE_LINKER_FLAGS";
    }
    local_158._M_string_length = 0;
    local_158.field_2._M_local_buf[0] = '\0';
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    local_b0 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               linkFlags;
    bVar2 = std::operator!=(&local_e0,"Swift");
    if (bVar2) {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_101);
      psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_50);
      local_138._8_8_ = (psVar4->_M_dataplus)._M_p;
      local_138._0_8_ = psVar4->_M_string_length;
      local_a0._0_8_ = &DAT_00000001;
      local_a0[0x10] = ' ';
      local_a0._8_8_ = local_a0 + 0x10;
      cmStrCat<>(&local_100,(cmAlphaNum *)local_138,(cmAlphaNum *)local_a0);
      std::__cxx11::string::operator=((string *)&local_158,(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_50);
      if ((pointer)local_70._M_string_length != (pointer)0x0) {
        local_138._0_8_ = (pointer)0x19;
        local_a0._0_8_ = &DAT_00000001;
        local_a0[0x10] = '_';
        local_138._8_8_ = __s;
        local_a0._8_8_ = local_a0 + 0x10;
        cmStrCat<std::__cxx11::string>
                  (&local_100,(cmAlphaNum *)local_138,(cmAlphaNum *)local_a0,&local_70);
        cmMakefile::GetSafeDefinition(this->Makefile,&local_100);
        std::__cxx11::string::append((string *)&local_158);
        std::__cxx11::string::append((char *)&local_158);
        std::__cxx11::string::~string((string *)&local_100);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,"LINK_FLAGS",(allocator<char> *)local_a0);
    cVar5 = cmGeneratorTarget::GetProperty(target,(string *)local_138);
    linkFlags = (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_b0;
    std::__cxx11::string::~string((string *)local_138);
    if (cVar5.Value != (string *)0x0) {
      std::__cxx11::string::append((string *)&local_158);
      std::__cxx11::string::append((char *)&local_158);
    }
    if ((pointer)local_70._M_string_length != (pointer)0x0) {
      local_138._0_8_ = &DAT_0000000b;
      local_138._8_8_ = "LINK_FLAGS_";
      local_a0._0_8_ = local_70._M_string_length;
      local_a0._8_8_ = local_70._M_dataplus._M_p;
      cmStrCat<>(&local_100,(cmAlphaNum *)local_138,(cmAlphaNum *)local_a0);
      cVar5 = cmGeneratorTarget::GetProperty(target,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      if (cVar5.Value != (string *)0x0) {
        std::__cxx11::string::append((string *)&local_158);
        std::__cxx11::string::append((char *)&local_158);
      }
    }
    if (local_158._M_string_length != 0) {
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<std::__cxx11::string>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 linkFlags,&local_158);
    }
    cmGeneratorTarget::GetLinkOptions
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_138,target,config,&local_e0);
    AppendCompileOptions
              (this,linkFlags,
               (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_138,(char *)0x0);
    if (local_c0 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(this,local_c0,local_b8,local_a8,frameworkPath,linkPath);
    }
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_138);
LAB_0022d57c:
    std::__cxx11::string::~string((string *)&local_158);
  }
LAB_0022d584:
  local_138._0_8_ = local_138 + 0x10;
  local_138._8_8_ = (pointer)0x0;
  local_138[0x10] = '\0';
  AppendPositionIndependentLinkerFlags(this,(string *)local_138,target,config,&local_e0);
  AppendIPOLinkerFlags(this,(string *)local_138,target,config,&local_e0);
  AppendModuleDefinitionFlag(this,(string *)local_138,target,local_b8,config);
  if ((pointer)local_138._8_8_ != (pointer)0x0) {
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               linkFlags,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138);
  }
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138;
LAB_0022d5fa:
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void cmLocalGenerator::GetTargetFlags(
  cmLinkLineComputer* linkLineComputer, const std::string& config,
  std::vector<BT<std::string>>& linkLibs, std::string& flags,
  std::vector<BT<std::string>>& linkFlags, std::string& frameworkPath,
  std::vector<BT<std::string>>& linkPath, cmGeneratorTarget* target)
{
  const std::string configUpper = cmSystemTools::UpperCase(config);
  cmComputeLinkInformation* pcli = target->GetLinkInformation(config);
  const char* libraryLinkVariable =
    "CMAKE_SHARED_LINKER_FLAGS"; // default to shared library

  const std::string linkLanguage =
    linkLineComputer->GetLinkerLanguage(target, config);

  switch (target->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      linkFlags = this->GetStaticLibraryFlags(config, linkLanguage, target);
      break;
    case cmStateEnums::MODULE_LIBRARY:
      libraryLinkVariable = "CMAKE_MODULE_LINKER_FLAGS";
      CM_FALLTHROUGH;
    case cmStateEnums::SHARED_LIBRARY: {
      std::string sharedLibFlags;
      if (linkLanguage != "Swift") {
        sharedLibFlags = cmStrCat(
          this->Makefile->GetSafeDefinition(libraryLinkVariable), ' ');
        if (!configUpper.empty()) {
          std::string build = cmStrCat(libraryLinkVariable, '_', configUpper);
          sharedLibFlags += this->Makefile->GetSafeDefinition(build);
          sharedLibFlags += " ";
        }
      }

      cmValue targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        sharedLibFlags += *targetLinkFlags;
        sharedLibFlags += " ";
      }
      if (!configUpper.empty()) {
        targetLinkFlags =
          target->GetProperty(cmStrCat("LINK_FLAGS_", configUpper));
        if (targetLinkFlags) {
          sharedLibFlags += *targetLinkFlags;
          sharedLibFlags += " ";
        }
      }

      if (!sharedLibFlags.empty()) {
        linkFlags.emplace_back(std::move(sharedLibFlags));
      }

      std::vector<BT<std::string>> linkOpts =
        target->GetLinkOptions(config, linkLanguage);
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, linkOpts);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }
    } break;
    case cmStateEnums::EXECUTABLE: {
      std::string exeFlags;
      if (linkLanguage != "Swift") {
        exeFlags = this->Makefile->GetSafeDefinition("CMAKE_EXE_LINKER_FLAGS");
        exeFlags += " ";
        if (!configUpper.empty()) {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_EXE_LINKER_FLAGS_", configUpper));
          exeFlags += " ";
        }
        if (linkLanguage.empty()) {
          cmSystemTools::Error(
            "CMake can not determine linker language for target: " +
            target->GetName());
          return;
        }

        if (target->IsWin32Executable(config)) {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_", linkLanguage, "_CREATE_WIN32_EXE"));
          exeFlags += " ";
        } else {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_", linkLanguage, "_CREATE_CONSOLE_EXE"));
          exeFlags += " ";
        }

        if (target->IsExecutableWithExports()) {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_EXE_EXPORTS_", linkLanguage, "_FLAG"));
          exeFlags += " ";
        }
      }

      this->AddLanguageFlagsForLinking(flags, target, linkLanguage, config);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }

      if (this->Makefile->IsOn("BUILD_SHARED_LIBS")) {
        std::string sFlagVar = "CMAKE_SHARED_BUILD_" + linkLanguage + "_FLAGS";
        exeFlags += this->Makefile->GetSafeDefinition(sFlagVar);
        exeFlags += " ";
      }

      std::string cmp0065Flags =
        this->GetLinkLibsCMP0065(linkLanguage, *target);
      if (!cmp0065Flags.empty()) {
        exeFlags += cmp0065Flags;
        exeFlags += " ";
      }

      cmValue targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        exeFlags += *targetLinkFlags;
        exeFlags += " ";
      }
      if (!configUpper.empty()) {
        targetLinkFlags =
          target->GetProperty(cmStrCat("LINK_FLAGS_", configUpper));
        if (targetLinkFlags) {
          exeFlags += *targetLinkFlags;
          exeFlags += " ";
        }
      }

      if (!exeFlags.empty()) {
        linkFlags.emplace_back(std::move(exeFlags));
      }

      std::vector<BT<std::string>> linkOpts =
        target->GetLinkOptions(config, linkLanguage);
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, linkOpts);
    } break;
    default:
      break;
  }

  std::string extraLinkFlags;
  this->AppendPositionIndependentLinkerFlags(extraLinkFlags, target, config,
                                             linkLanguage);
  this->AppendIPOLinkerFlags(extraLinkFlags, target, config, linkLanguage);
  this->AppendModuleDefinitionFlag(extraLinkFlags, target, linkLineComputer,
                                   config);

  if (!extraLinkFlags.empty()) {
    linkFlags.emplace_back(std::move(extraLinkFlags));
  }
}